

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool duckdb::ReplaceUnicodeSpaces
               (string *query,string *new_query,vector<duckdb::UnicodeSpace,_true> *unicode_spaces)

{
  bool bVar1;
  undefined8 in_RDX;
  string *in_RSI;
  ulong in_RDI;
  UnicodeSpace *usp;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::UnicodeSpace,_true> *__range1;
  idx_t prev;
  vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_> *in_stack_ffffffffffffff48;
  __normal_iterator<duckdb::UnicodeSpace_*,_std::vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_>_>
  *in_stack_ffffffffffffff50;
  vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_> *in_stack_ffffffffffffff60;
  string *psVar2;
  string local_98 [48];
  string local_68 [32];
  reference local_48;
  UnicodeSpace *local_40;
  __normal_iterator<duckdb::UnicodeSpace_*,_std::vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_>_>
  local_38;
  undefined8 local_30;
  long local_28;
  undefined8 local_20;
  string *local_18;
  ulong local_10;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = ::std::vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_>::empty
                    (in_stack_ffffffffffffff60);
  if (bVar1) {
    local_1 = false;
  }
  else {
    local_28 = 0;
    local_30 = local_20;
    local_38._M_current =
         (UnicodeSpace *)
         ::std::vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_>::begin
                   (in_stack_ffffffffffffff48);
    local_40 = (UnicodeSpace *)
               ::std::vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_>::end
                         (in_stack_ffffffffffffff48);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff50,
                         (__normal_iterator<duckdb::UnicodeSpace_*,_std::vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_>_>
                          *)in_stack_ffffffffffffff48);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<duckdb::UnicodeSpace_*,_std::vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_>_>
                 ::operator*(&local_38);
      psVar2 = local_68;
      ::std::__cxx11::string::substr((ulong)psVar2,local_10);
      ::std::__cxx11::string::operator+=(local_18,psVar2);
      ::std::__cxx11::string::~string(local_68);
      ::std::__cxx11::string::operator+=(local_18," ");
      local_28 = local_48->pos + local_48->bytes;
      __gnu_cxx::
      __normal_iterator<duckdb::UnicodeSpace_*,_std::vector<duckdb::UnicodeSpace,_std::allocator<duckdb::UnicodeSpace>_>_>
      ::operator++(&local_38);
    }
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::substr((ulong)local_98,local_10);
    ::std::__cxx11::string::operator+=(local_18,local_98);
    ::std::__cxx11::string::~string(local_98);
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool ReplaceUnicodeSpaces(const string &query, string &new_query, vector<UnicodeSpace> &unicode_spaces) {
	if (unicode_spaces.empty()) {
		// no unicode spaces found
		return false;
	}
	idx_t prev = 0;
	for (auto &usp : unicode_spaces) {
		new_query += query.substr(prev, usp.pos - prev);
		new_query += " ";
		prev = usp.pos + usp.bytes;
	}
	new_query += query.substr(prev, query.size() - prev);
	return true;
}